

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SliceLayerParams::SerializeWithCachedSizes
          (SliceLayerParams *this,CodedOutputStream *output)

{
  SliceLayerParams_SliceAxis SVar1;
  int64 iVar2;
  uint64 uVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SliceLayerParams *this_local;
  
  iVar2 = startindex(this);
  if (iVar2 != 0) {
    iVar2 = startindex(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  iVar2 = endindex(this);
  if (iVar2 != 0) {
    iVar2 = endindex(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(2,iVar2,output);
  }
  uVar3 = stride(this);
  if (uVar3 != 0) {
    uVar3 = stride(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(3,uVar3,output);
  }
  SVar1 = axis(this);
  if (SVar1 != SliceLayerParams_SliceAxis_CHANNEL_AXIS) {
    SVar1 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(4,SVar1,output);
  }
  return;
}

Assistant:

void SliceLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 startIndex = 1;
  if (this->startindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->startindex(), output);
  }

  // int64 endIndex = 2;
  if (this->endindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->endindex(), output);
  }

  // uint64 stride = 3;
  if (this->stride() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(3, this->stride(), output);
  }

  // .CoreML.Specification.SliceLayerParams.SliceAxis axis = 4;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      4, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceLayerParams)
}